

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mime.h
# Opt level: O2

string * MimeTypes::get(string *__return_storage_ptr__,string *ext)

{
  __type _Var1;
  MIME_ITEMS *__rhs;
  long lVar2;
  allocator<char> local_21;
  
  lVar2 = 0;
  __rhs = mimeType;
  do {
    lVar2 = lVar2 + -0x40;
    if (lVar2 == -0x5600) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_21);
      return __return_storage_ptr__;
    }
    _Var1 = std::operator==(ext,&__rhs->extension);
    __rhs = __rhs + 1;
  } while (!_Var1);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&completed_0 + -lVar2));
  return __return_storage_ptr__;
}

Assistant:

static std::string get(std::string ext)
    {
        for (int i = 0; i < MIME_SIZE; i++) {
            if (ext == MimeTypes::mimeType[i].extension) return MimeTypes::mimeType[i].mime;
        }
        return "";
    }